

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cc
# Opt level: O3

void __thiscall gss::innards::Proof::start_adjacency_constraints_for(Proof *this,int p,int t)

{
  ostream *poVar1;
  char local_19;
  
  poVar1 = (ostream *)
           &((this->_imp)._M_t.
             super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
             ._M_t.
             super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
             .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->field_0x50;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"* adjacency ",0xc);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," maps to ",9);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,t);
  local_19 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_19,1);
  return;
}

Assistant:

auto Proof::start_adjacency_constraints_for(int p, int t) -> void
{
    _imp->model_stream << "* adjacency " << p << " maps to " << t << '\n';
}